

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t avx2_harley_seal_popcount256(__m256i *data,uint64_t size)

{
  undefined1 auVar1 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  __m256i c_06;
  __m256i c_07;
  __m256i c_08;
  __m256i c_09;
  __m256i c_10;
  __m256i c_11;
  __m256i c_12;
  __m256i c_13;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  __m256i b_13;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  __m256i v;
  __m256i v_00;
  __m256i v_01;
  __m256i v_02;
  __m256i v_03;
  __m256i v_04;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  ulong in_RSI;
  long in_RDI;
  undefined8 uVar5;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar6 [32];
  uint64_t i;
  uint64_t limit;
  __m256i eightsB;
  __m256i eightsA;
  __m256i foursB;
  __m256i foursA;
  __m256i twosB;
  __m256i twosA;
  __m256i sixteens;
  __m256i eights;
  __m256i fours;
  __m256i twos;
  __m256i ones;
  __m256i total;
  undefined8 in_stack_fffffffffffff018;
  undefined8 in_stack_fffffffffffff020;
  undefined8 in_stack_fffffffffffff028;
  longlong in_stack_fffffffffffff030;
  undefined8 in_stack_fffffffffffff038;
  undefined8 in_stack_fffffffffffff040;
  undefined8 in_stack_fffffffffffff048;
  longlong in_stack_fffffffffffff050;
  undefined8 in_stack_fffffffffffff058;
  undefined8 in_stack_fffffffffffff060;
  undefined8 in_stack_fffffffffffff068;
  longlong in_stack_fffffffffffff070;
  __m256i *in_stack_fffffffffffff088;
  __m256i *in_stack_fffffffffffff090;
  undefined8 in_stack_fffffffffffff138;
  undefined8 in_stack_fffffffffffff140;
  undefined8 in_stack_fffffffffffff148;
  longlong in_stack_fffffffffffff150;
  longlong lVar10;
  undefined8 local_7b0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined8 local_4e0;
  
  local_4e0 = 0;
  local_640 = ZEXT832(0);
  uStack_658 = 0;
  uStack_650 = 0;
  uStack_648 = 0;
  uStack_678 = 0;
  uStack_670 = 0;
  uStack_668 = 0;
  uStack_698 = 0;
  uStack_690 = 0;
  uStack_688 = 0;
  uStack_6b8 = 0;
  uStack_6b0 = 0;
  uStack_6a8 = 0;
  uStack_6d8 = 0;
  uStack_6d0 = 0;
  uStack_6c8 = 0;
  for (local_7b0 = 0; local_7b0 < in_RSI - (in_RSI & 0xf); local_7b0 = local_7b0 + 0x10) {
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x20));
    a[1] = in_stack_fffffffffffff060;
    a[0] = in_stack_fffffffffffff058;
    a[2] = in_stack_fffffffffffff068;
    a[3] = in_stack_fffffffffffff070;
    b[1] = in_stack_fffffffffffff040;
    b[0] = in_stack_fffffffffffff038;
    b[2] = in_stack_fffffffffffff048;
    b[3] = in_stack_fffffffffffff050;
    c[1] = in_stack_fffffffffffff020;
    c[0] = in_stack_fffffffffffff018;
    c[2] = in_stack_fffffffffffff028;
    c[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a,b,c);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x40));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x60));
    a_00[1] = in_stack_fffffffffffff060;
    a_00[0] = in_stack_fffffffffffff058;
    a_00[2] = in_stack_fffffffffffff068;
    a_00[3] = in_stack_fffffffffffff070;
    b_00[1] = in_stack_fffffffffffff040;
    b_00[0] = in_stack_fffffffffffff038;
    b_00[2] = in_stack_fffffffffffff048;
    b_00[3] = in_stack_fffffffffffff050;
    c_00[1] = in_stack_fffffffffffff020;
    c_00[0] = in_stack_fffffffffffff018;
    c_00[2] = in_stack_fffffffffffff028;
    c_00[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_00,b_00,c_00);
    a_01[1] = in_stack_fffffffffffff060;
    a_01[0] = in_stack_fffffffffffff058;
    a_01[2] = in_stack_fffffffffffff068;
    a_01[3] = in_stack_fffffffffffff070;
    b_01[1] = in_stack_fffffffffffff040;
    b_01[0] = in_stack_fffffffffffff038;
    b_01[2] = in_stack_fffffffffffff048;
    b_01[3] = in_stack_fffffffffffff050;
    c_01[1] = in_stack_fffffffffffff020;
    c_01[0] = in_stack_fffffffffffff018;
    c_01[2] = in_stack_fffffffffffff028;
    c_01[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_01,b_01,c_01);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x80));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0xa0));
    a_02[1] = in_stack_fffffffffffff060;
    a_02[0] = in_stack_fffffffffffff058;
    a_02[2] = in_stack_fffffffffffff068;
    a_02[3] = in_stack_fffffffffffff070;
    b_02[1] = in_stack_fffffffffffff040;
    b_02[0] = in_stack_fffffffffffff038;
    b_02[2] = in_stack_fffffffffffff048;
    b_02[3] = in_stack_fffffffffffff050;
    c_02[1] = in_stack_fffffffffffff020;
    c_02[0] = in_stack_fffffffffffff018;
    c_02[2] = in_stack_fffffffffffff028;
    c_02[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_02,b_02,c_02);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0xc0));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0xe0));
    a_03[1] = in_stack_fffffffffffff060;
    a_03[0] = in_stack_fffffffffffff058;
    a_03[2] = in_stack_fffffffffffff068;
    a_03[3] = in_stack_fffffffffffff070;
    b_03[1] = in_stack_fffffffffffff040;
    b_03[0] = in_stack_fffffffffffff038;
    b_03[2] = in_stack_fffffffffffff048;
    b_03[3] = in_stack_fffffffffffff050;
    c_03[1] = in_stack_fffffffffffff020;
    c_03[0] = in_stack_fffffffffffff018;
    c_03[2] = in_stack_fffffffffffff028;
    c_03[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_03,b_03,c_03);
    a_04[1] = in_stack_fffffffffffff060;
    a_04[0] = in_stack_fffffffffffff058;
    a_04[2] = in_stack_fffffffffffff068;
    a_04[3] = in_stack_fffffffffffff070;
    b_04[1] = in_stack_fffffffffffff040;
    b_04[0] = in_stack_fffffffffffff038;
    b_04[2] = in_stack_fffffffffffff048;
    b_04[3] = in_stack_fffffffffffff050;
    c_04[1] = in_stack_fffffffffffff020;
    c_04[0] = in_stack_fffffffffffff018;
    c_04[2] = in_stack_fffffffffffff028;
    c_04[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_04,b_04,c_04);
    a_05[1] = in_stack_fffffffffffff060;
    a_05[0] = in_stack_fffffffffffff058;
    a_05[2] = in_stack_fffffffffffff068;
    a_05[3] = in_stack_fffffffffffff070;
    b_05[1] = in_stack_fffffffffffff040;
    b_05[0] = in_stack_fffffffffffff038;
    b_05[2] = in_stack_fffffffffffff048;
    b_05[3] = in_stack_fffffffffffff050;
    c_05[1] = in_stack_fffffffffffff020;
    c_05[0] = in_stack_fffffffffffff018;
    c_05[2] = in_stack_fffffffffffff028;
    c_05[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_05,b_05,c_05);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x100));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x120));
    a_06[1] = in_stack_fffffffffffff060;
    a_06[0] = in_stack_fffffffffffff058;
    a_06[2] = in_stack_fffffffffffff068;
    a_06[3] = in_stack_fffffffffffff070;
    b_06[1] = in_stack_fffffffffffff040;
    b_06[0] = in_stack_fffffffffffff038;
    b_06[2] = in_stack_fffffffffffff048;
    b_06[3] = in_stack_fffffffffffff050;
    c_06[1] = in_stack_fffffffffffff020;
    c_06[0] = in_stack_fffffffffffff018;
    c_06[2] = in_stack_fffffffffffff028;
    c_06[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_06,b_06,c_06);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x140));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x160));
    a_07[1] = in_stack_fffffffffffff060;
    a_07[0] = in_stack_fffffffffffff058;
    a_07[2] = in_stack_fffffffffffff068;
    a_07[3] = in_stack_fffffffffffff070;
    b_07[1] = in_stack_fffffffffffff040;
    b_07[0] = in_stack_fffffffffffff038;
    b_07[2] = in_stack_fffffffffffff048;
    b_07[3] = in_stack_fffffffffffff050;
    c_07[1] = in_stack_fffffffffffff020;
    c_07[0] = in_stack_fffffffffffff018;
    c_07[2] = in_stack_fffffffffffff028;
    c_07[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_07,b_07,c_07);
    a_08[1] = in_stack_fffffffffffff060;
    a_08[0] = in_stack_fffffffffffff058;
    a_08[2] = in_stack_fffffffffffff068;
    a_08[3] = in_stack_fffffffffffff070;
    b_08[1] = in_stack_fffffffffffff040;
    b_08[0] = in_stack_fffffffffffff038;
    b_08[2] = in_stack_fffffffffffff048;
    b_08[3] = in_stack_fffffffffffff050;
    c_08[1] = in_stack_fffffffffffff020;
    c_08[0] = in_stack_fffffffffffff018;
    c_08[2] = in_stack_fffffffffffff028;
    c_08[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_08,b_08,c_08);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x180));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x1a0));
    a_09[1] = in_stack_fffffffffffff060;
    a_09[0] = in_stack_fffffffffffff058;
    a_09[2] = in_stack_fffffffffffff068;
    a_09[3] = in_stack_fffffffffffff070;
    b_09[1] = in_stack_fffffffffffff040;
    b_09[0] = in_stack_fffffffffffff038;
    b_09[2] = in_stack_fffffffffffff048;
    b_09[3] = in_stack_fffffffffffff050;
    c_09[1] = in_stack_fffffffffffff020;
    c_09[0] = in_stack_fffffffffffff018;
    c_09[2] = in_stack_fffffffffffff028;
    c_09[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_09,b_09,c_09);
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x1c0));
    vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20 + 0x1e0));
    a_10[1] = in_stack_fffffffffffff060;
    a_10[0] = in_stack_fffffffffffff058;
    a_10[2] = in_stack_fffffffffffff068;
    a_10[3] = in_stack_fffffffffffff070;
    b_10[1] = in_stack_fffffffffffff040;
    b_10[0] = in_stack_fffffffffffff038;
    b_10[2] = in_stack_fffffffffffff048;
    b_10[3] = in_stack_fffffffffffff050;
    c_10[1] = in_stack_fffffffffffff020;
    c_10[0] = in_stack_fffffffffffff018;
    c_10[2] = in_stack_fffffffffffff028;
    c_10[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_10,b_10,c_10);
    a_11[1] = in_stack_fffffffffffff060;
    a_11[0] = in_stack_fffffffffffff058;
    a_11[2] = in_stack_fffffffffffff068;
    a_11[3] = in_stack_fffffffffffff070;
    b_11[1] = in_stack_fffffffffffff040;
    b_11[0] = in_stack_fffffffffffff038;
    b_11[2] = in_stack_fffffffffffff048;
    b_11[3] = in_stack_fffffffffffff050;
    c_11[1] = in_stack_fffffffffffff020;
    c_11[0] = in_stack_fffffffffffff018;
    c_11[2] = in_stack_fffffffffffff028;
    c_11[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_11,b_11,c_11);
    a_12[1] = in_stack_fffffffffffff060;
    a_12[0] = in_stack_fffffffffffff058;
    a_12[2] = in_stack_fffffffffffff068;
    a_12[3] = in_stack_fffffffffffff070;
    b_12[1] = in_stack_fffffffffffff040;
    b_12[0] = in_stack_fffffffffffff038;
    b_12[2] = in_stack_fffffffffffff048;
    b_12[3] = in_stack_fffffffffffff050;
    c_12[1] = in_stack_fffffffffffff020;
    c_12[0] = in_stack_fffffffffffff018;
    c_12[2] = in_stack_fffffffffffff028;
    c_12[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_12,b_12,c_12);
    a_13[1] = in_stack_fffffffffffff060;
    a_13[0] = in_stack_fffffffffffff058;
    a_13[2] = in_stack_fffffffffffff068;
    a_13[3] = in_stack_fffffffffffff070;
    b_13[1] = in_stack_fffffffffffff040;
    b_13[0] = in_stack_fffffffffffff038;
    b_13[2] = in_stack_fffffffffffff048;
    b_13[3] = in_stack_fffffffffffff050;
    c_13[1] = in_stack_fffffffffffff020;
    c_13[0] = in_stack_fffffffffffff018;
    c_13[2] = in_stack_fffffffffffff028;
    c_13[3] = in_stack_fffffffffffff030;
    CSA(in_stack_fffffffffffff090,in_stack_fffffffffffff088,a_13,b_13,c_13);
    v[1] = in_stack_fffffffffffff140;
    v[0] = in_stack_fffffffffffff138;
    v[2] = in_stack_fffffffffffff148;
    v[3] = in_stack_fffffffffffff150;
    uVar5 = local_4e0;
    uVar7 = uStack_6d8;
    uVar8 = uStack_6d0;
    uVar9 = uStack_6c8;
    popcount256(v);
    auVar6._8_8_ = uVar7;
    auVar6._0_8_ = uVar5;
    auVar6._16_8_ = uVar8;
    auVar6._24_8_ = uVar9;
    local_640 = vpaddq_avx2(local_640,auVar6);
  }
  auVar6 = vpsllq_avx2(local_640,ZEXT416(4));
  v_00[1] = in_stack_fffffffffffff140;
  v_00[0] = in_stack_fffffffffffff138;
  v_00[2] = in_stack_fffffffffffff148;
  v_00[3] = in_stack_fffffffffffff150;
  uVar5 = local_4e0;
  popcount256(v_00);
  auVar4._8_8_ = uStack_6b8;
  auVar4._0_8_ = uVar5;
  auVar4._16_8_ = uStack_6b0;
  auVar4._24_8_ = uStack_6a8;
  auVar1 = vpsllq_avx2(auVar4,ZEXT416(3));
  auVar6 = vpaddq_avx2(auVar6,auVar1);
  local_640._0_8_ = auVar6._0_8_;
  local_640._8_8_ = auVar6._8_8_;
  local_640._16_8_ = auVar6._16_8_;
  v_01[1] = in_stack_fffffffffffff140;
  v_01[0] = in_stack_fffffffffffff138;
  v_01[2] = in_stack_fffffffffffff148;
  v_01[3] = in_stack_fffffffffffff150;
  uVar5 = local_4e0;
  popcount256(v_01);
  auVar3._8_8_ = uStack_698;
  auVar3._0_8_ = uVar5;
  auVar3._16_8_ = uStack_690;
  auVar3._24_8_ = uStack_688;
  auVar1 = vpsllq_avx2(auVar3,ZEXT416(2));
  uVar8 = auVar1._24_8_;
  auVar6 = vpaddq_avx2(auVar6,auVar1);
  v_02[1] = local_640._0_8_;
  v_02[0] = uVar8;
  v_02[2] = local_640._8_8_;
  v_02[3] = local_640._16_8_;
  uVar5 = local_4e0;
  popcount256(v_02);
  auVar2._8_8_ = uStack_678;
  auVar2._0_8_ = uVar5;
  auVar2._16_8_ = uStack_670;
  auVar2._24_8_ = uStack_668;
  auVar1 = vpsllq_avx2(auVar2,ZEXT416(1));
  auVar6 = vpaddq_avx2(auVar6,auVar1);
  v_03[1] = local_640._0_8_;
  v_03[0] = uVar8;
  v_03[2] = local_640._8_8_;
  v_03[3] = local_640._16_8_;
  popcount256(v_03);
  auVar1._8_8_ = uStack_658;
  auVar1._0_8_ = local_4e0;
  auVar1._16_8_ = uStack_650;
  auVar1._24_8_ = uStack_648;
  auVar6 = vpaddq_avx2(auVar6,auVar1);
  uVar5 = local_640._0_8_;
  uVar7 = local_640._8_8_;
  lVar10 = local_640._16_8_;
  local_640 = auVar6;
  for (; local_7b0 < in_RSI; local_7b0 = local_7b0 + 1) {
    auVar6 = vlddqu_avx(*(undefined1 (*) [32])(in_RDI + local_7b0 * 0x20));
    v_04[1] = uVar5;
    v_04[0] = uVar8;
    v_04[2] = uVar7;
    v_04[3] = lVar10;
    popcount256(v_04);
    local_640 = vpaddq_avx2(local_640,auVar6);
  }
  return local_640._0_8_ + local_640._8_8_ + local_640._16_8_ + local_640._24_8_;
}

Assistant:

inline static uint64_t avx2_harley_seal_popcount256(const __m256i *data,
                                                    const uint64_t size) {
    __m256i total = _mm256_setzero_si256();
    __m256i ones = _mm256_setzero_si256();
    __m256i twos = _mm256_setzero_si256();
    __m256i fours = _mm256_setzero_si256();
    __m256i eights = _mm256_setzero_si256();
    __m256i sixteens = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;

    for (; i < limit; i += 16) {
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i),
            _mm256_lddqu_si256(data + i + 1));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 2),
            _mm256_lddqu_si256(data + i + 3));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 4),
            _mm256_lddqu_si256(data + i + 5));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 6),
            _mm256_lddqu_si256(data + i + 7));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsA, &fours, fours, foursA, foursB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 8),
            _mm256_lddqu_si256(data + i + 9));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 10),
            _mm256_lddqu_si256(data + i + 11));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 12),
            _mm256_lddqu_si256(data + i + 13));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 14),
            _mm256_lddqu_si256(data + i + 15));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsB, &fours, fours, foursA, foursB);
        CSA(&sixteens, &eights, eights, eightsA, eightsB);

        total = _mm256_add_epi64(total, popcount256(sixteens));
    }

    total = _mm256_slli_epi64(total, 4);  // * 16
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(eights), 3));  // += 8 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(fours), 2));  // += 4 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(twos), 1));  // += 2 * ...
    total = _mm256_add_epi64(total, popcount256(ones));
    for (; i < size; i++)
        total =
            _mm256_add_epi64(total, popcount256(_mm256_lddqu_si256(data + i)));

    return (uint64_t)(_mm256_extract_epi64(total, 0)) +
           (uint64_t)(_mm256_extract_epi64(total, 1)) +
           (uint64_t)(_mm256_extract_epi64(total, 2)) +
           (uint64_t)(_mm256_extract_epi64(total, 3));
}